

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_53533::ParserImpl::ParseTableIndexField(ParserImpl *this)

{
  TokenDetail op;
  TokenDetail op_00;
  TokenDetail *pTVar1;
  undefined8 uVar2;
  long in_RSI;
  __uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> in_RDI;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> value;
  int in_stack_000000cc;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_000000d0;
  ParserImpl *in_stack_000000d8;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> index;
  undefined1 in_stack_000000f0 [24];
  int line;
  ParserImpl *in_stack_fffffffffffffef0;
  int line_00;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_ffffffffffffff08;
  TableIndexField *this_00;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  char *in_stack_ffffffffffffff68;
  SyntaxTree in_stack_ffffffffffffff70;
  anon_union_8_2_010d16d7_for_TokenDetail_0 local_88;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> uStack_80;
  undefined8 local_78;
  int iStack_74;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *puStack_70;
  undefined1 local_48 [52];
  int local_14;
  
  NextToken(in_stack_fffffffffffffef0);
  if (*(int *)(in_RSI + 0x20) != 0x5b) {
    __assert_fail("current_.token_ == \'[\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                  ,0x313,
                  "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseTableIndexField()"
                 );
  }
  pTVar1 = LookAhead(in_stack_fffffffffffffef0);
  local_14 = pTVar1->line_;
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<std::default_delete<luna::SyntaxTree>,void>
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_fffffffffffffef0);
  luna::TokenDetail::TokenDetail((TokenDetail *)local_48);
  op._24_8_ = this;
  op._0_24_ = in_stack_000000f0;
  ParseExp(in_stack_000000d8,in_stack_000000d0,op,in_stack_000000cc);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)local_48._24_8_
            );
  pTVar1 = NextToken((ParserImpl *)local_48._8_8_);
  if (pTVar1->token_ != 0x5d) {
    uVar2 = __cxa_allocate_exception(0x20);
    luna::ParseException::ParseException
              ((ParseException *)in_stack_ffffffffffffff70._vptr_SyntaxTree,
               in_stack_ffffffffffffff68,
               (TokenDetail *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
  }
  pTVar1 = NextToken((ParserImpl *)local_48._8_8_);
  if (pTVar1->token_ != 0x3d) {
    uVar2 = __cxa_allocate_exception(0x20);
    luna::ParseException::ParseException
              ((ParseException *)in_stack_ffffffffffffff70._vptr_SyntaxTree,
               in_stack_ffffffffffffff68,
               (TokenDetail *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
  }
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<std::default_delete<luna::SyntaxTree>,void>
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)local_48._8_8_)
  ;
  luna::TokenDetail::TokenDetail((TokenDetail *)&local_88);
  op_00._24_8_ = this;
  op_00._0_24_ = in_stack_000000f0;
  line_00 = iStack_74;
  ParseExp(in_stack_000000d8,in_stack_000000d0,op_00,in_stack_000000cc);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(puStack_70)
  ;
  operator_new(0x20);
  this_00 = (TableIndexField *)&stack0xffffffffffffff70;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             uStack_80._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,
             (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)local_88.str_);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             uStack_80._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,
             (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)local_88.str_);
  luna::TableIndexField::TableIndexField(this_00,in_stack_ffffffffffffff08,puStack_70,line_00);
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<std::default_delete<luna::SyntaxTree>,void>
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             uStack_80._M_t.
             super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl,(pointer)local_88.str_);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(puStack_70)
  ;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(puStack_70)
  ;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(puStack_70)
  ;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr(puStack_70)
  ;
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
         in_RDI.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t
         .super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseTableIndexField()
        {
            NextToken();
            assert(current_.token_ == '[');

            int line = LookAhead().line_;
            std::unique_ptr<SyntaxTree> index = ParseExp();

            if (NextToken().token_ != ']')
                throw ParseException("expect ']'", current_);

            if (NextToken().token_ != '=')
                throw ParseException("expect '='", current_);

            std::unique_ptr<SyntaxTree> value = ParseExp();

            return std::unique_ptr<SyntaxTree>(new TableIndexField(std::move(index),
                                                                   std::move(value),
                                                                   line));
        }